

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt
          (LocationRecorder *this,LocationRecorder *other)

{
  SourceCodeInfo_Location *pSVar1;
  int32_t iVar2;
  
  pSVar1 = this->location_;
  iVar2 = SourceCodeInfo_Location::_internal_span(other->location_,0);
  SourceCodeInfo_Location::set_span(pSVar1,0,iVar2);
  pSVar1 = this->location_;
  iVar2 = SourceCodeInfo_Location::_internal_span(other->location_,1);
  SourceCodeInfo_Location::set_span(pSVar1,1,iVar2);
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const LocationRecorder& other) {
  location_->set_span(0, other.location_->span(0));
  location_->set_span(1, other.location_->span(1));
}